

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::FirstState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::FirstFunction<false,false>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  undefined8 uVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  data_ptr_t pdVar9;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = *(undefined8 **)states->data;
    if (*(char *)(puVar1 + 2) == '\0') {
      pdVar9 = input->data;
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
        *(undefined2 *)(puVar1 + 2) = 1;
        uVar4 = *(undefined8 *)(pdVar9 + 8);
        *puVar1 = *(undefined8 *)pdVar9;
        puVar1[1] = uVar4;
      }
      else {
        *(undefined2 *)(puVar1 + 2) = 0x101;
      }
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar9 = input->data;
    pdVar3 = states->data;
    FlatVector::VerifyFlatVector(input);
    if (count != 0) {
      uVar5 = 0;
      do {
        puVar1 = *(undefined8 **)(pdVar3 + uVar5 * 8);
        if (*(char *)(puVar1 + 2) == '\0') {
          puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0))
          {
            *(undefined2 *)(puVar1 + 2) = 1;
            uVar4 = *(undefined8 *)(pdVar9 + 8);
            *puVar1 = *(undefined8 *)pdVar9;
            puVar1[1] = uVar4;
          }
          else {
            *(undefined2 *)(puVar1 + 2) = 0x101;
          }
        }
        uVar5 = uVar5 + 1;
        pdVar9 = pdVar9 + 0x10;
      } while (count != uVar5);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_b0);
    Vector::ToUnifiedFormat(states,count,&local_68);
    if (count != 0) {
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if ((local_b0.sel)->sel_vector != (sel_t *)0x0) {
          iVar7 = (idx_t)(local_b0.sel)->sel_vector[iVar6];
        }
        iVar8 = iVar6;
        if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
          iVar8 = (idx_t)(local_68.sel)->sel_vector[iVar6];
        }
        puVar1 = *(undefined8 **)(local_68.data + iVar8 * 8);
        if (*(char *)(puVar1 + 2) == '\0') {
          if ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar7 >> 6] >> (iVar7 & 0x3f) & 1) != 0)) {
            *(undefined2 *)(puVar1 + 2) = 1;
            uVar4 = *(undefined8 *)(local_b0.data + iVar7 * 0x10 + 8);
            *puVar1 = *(undefined8 *)(local_b0.data + iVar7 * 0x10);
            puVar1[1] = uVar4;
          }
          else {
            *(undefined2 *)(puVar1 + 2) = 0x101;
          }
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}